

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  byte *pbVar1;
  u32 *puVar2;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  u8 uVar7;
  uchar uVar8;
  u16 uVar9;
  int iCursor;
  Parse *pParse;
  sqlite3 *db;
  WhereMaskSet *pMaskSet;
  WhereClause *p;
  WhereClause *pExpr;
  sqlite3 *db_00;
  ExprList_item *pEVar10;
  Vdbe *pVVar11;
  Mem *pMVar12;
  Table *pTVar13;
  char cVar14;
  char cVar15;
  short sVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  Bitmask BVar22;
  char *pcVar23;
  ExprList *pEVar24;
  Expr *pEVar25;
  Expr *pEVar26;
  WhereClause *pWVar27;
  CollSeq *pCVar28;
  Bitmask BVar29;
  WhereOrInfo *pWC_00;
  FuncDef *pFVar30;
  sqlite3_value *pTo;
  uchar *puVar31;
  Expr *pRight;
  Expr *pEVar32;
  byte bVar33;
  ushort uVar34;
  ushort uVar35;
  short sVar36;
  int idxTerm_00;
  int idxTerm_01;
  int idxTerm_02;
  int idxTerm_03;
  char **ppcVar37;
  Table *pTVar38;
  u8 *puVar39;
  Parse *pPVar40;
  ushort uVar41;
  int iVar42;
  WhereClause *pWVar43;
  long lVar44;
  WhereTerm *pWVar45;
  WhereTerm *pWVar46;
  int iVar47;
  ulong uVar48;
  ulong uVar49;
  char **ppcVar50;
  bool bVar51;
  bool bVar52;
  ulong local_a8;
  ulong local_50;
  Token sCollSeqName;
  
  pParse = *(Parse **)pSrc;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  pMaskSet = (WhereMaskSet *)pSrc->a[0].pSchema;
  pTVar38 = pSrc->a[0].pTab;
  iVar42 = (int)pWC;
  lVar20 = (long)iVar42;
  lVar21 = lVar20 * 0x38;
  ppcVar37 = &pTVar38->zName + lVar20 * 7;
  p = (WhereClause *)(&pTVar38->zName)[lVar20 * 7];
  pWVar27 = p->pOuter;
  BVar22 = exprTableUsage(pMaskSet,(Expr *)pWVar27);
  bVar3 = *(byte *)&p->pParse;
  if (bVar3 == 0x49) {
    ppcVar37[5] = (char *)0x0;
    pcVar23 = (char *)0x0;
  }
  else {
    if (bVar3 == 0x48) {
      if (((ulong)p->pParse & 0x8000000) == 0) {
        pcVar23 = (char *)exprListTableUsage(pMaskSet,((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->
                                                      pList);
      }
      else {
        pcVar23 = (char *)exprSelectTableUsage
                                    (pMaskSet,(Select *)
                                              ((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->pList);
      }
    }
    else {
      pcVar23 = (char *)exprTableUsage(pMaskSet,*(Expr **)&p->op);
    }
    ppcVar37[5] = pcVar23;
  }
  pEVar24 = (ExprList *)exprTableUsage(pMaskSet,(Expr *)p);
  if (((ulong)p->pParse & 0x10000) == 0) {
    local_50 = 0;
  }
  else {
    BVar29 = getMask(pMaskSet,(int)*(i16 *)((long)&p->aStatic[0].pExpr + 4));
    pEVar24 = (ExprList *)((ulong)pEVar24 | BVar29);
    local_50 = BVar29 - 1;
  }
  ppcVar37[6] = (char *)pEVar24;
  ppcVar37[1] = (char *)0xffffffffffffffff;
  *(undefined2 *)(ppcVar37 + 3) = 0;
  if ((bVar3 & 0xfe) == 0x48 || bVar3 - 0x4c < 5) {
    pEVar25 = sqlite3ExprSkipCollate((Expr *)pWVar27);
    pEVar26 = sqlite3ExprSkipCollate(*(Expr **)&p->op);
    uVar34 = 0x400;
    if ((BVar22 & (ulong)pcVar23) == 0) {
      uVar34 = 0xfff;
    }
    if (pEVar25->op == 0x98) {
      iVar18 = pEVar25->iTable;
      *(int *)((long)ppcVar37 + 0xc) = iVar18;
      *(int *)(ppcVar37 + 2) = (int)pEVar25->iColumn;
      if (bVar3 == 0x48) {
        uVar41 = 1;
      }
      else if (bVar3 == 0x49) {
        uVar41 = 0x80;
      }
      else {
        uVar41 = (ushort)(2 << ((byte)(bVar3 - 0x4c) & 0x1f));
      }
      *(ushort *)(ppcVar37 + 3) = uVar41 & uVar34;
      bVar51 = -1 < iVar18;
    }
    else {
      bVar51 = false;
    }
    if ((pEVar26 != (Expr *)0x0) && (pEVar26->op == 0x98)) {
      if (bVar51) {
        pWVar27 = (WhereClause *)sqlite3ExprDup(db,(Expr *)p,0);
        if (db->mallocFailed != '\0') {
          sqlite3ExprDelete(db,(Expr *)pWVar27);
          return;
        }
        iVar18 = whereClauseInsert((WhereClause *)pSrc,(Expr *)pWVar27,'\x03');
        if (iVar18 == 0) {
          return;
        }
        pTVar38 = pSrc->a[0].pTab;
        *(int *)(&pTVar38->aCol + (long)iVar18 * 7) = iVar42;
        *(undefined1 *)((long)&pTVar38->pSelect + lVar21 + 3) = 1;
        pbVar1 = (byte *)((long)&pTVar38->pSelect + lVar21 + 2);
        *pbVar1 = *pbVar1 | 8;
        ppcVar37 = &pTVar38->zName + lVar20 * 7;
        ppcVar50 = &pTVar38->zName + (long)iVar18 * 7;
        if (((*(u8 *)&p->pParse == 'L') && (((ulong)p->pParse & 0x10000) == 0)) &&
           ((db->dbOptFlags & 0x200) == 0)) {
          *(byte *)((long)ppcVar37 + 0x19) = *(byte *)((long)ppcVar37 + 0x19) | 4;
          sVar16 = 0x400;
        }
        else {
          sVar16 = 0;
        }
      }
      else {
        sVar16 = 0;
        pWVar27 = p;
        ppcVar50 = ppcVar37;
      }
      pWVar43 = pWVar27->pOuter;
      uVar41 = (*(Expr **)&pWVar27->op)->flags;
      uVar35 = uVar41 & 0x100;
      if (uVar35 == (*(u16 *)((long)&pWVar43->pParse + 2) & 0x100)) {
        if (uVar35 == 0) {
          pCVar28 = sqlite3ExprCollSeq(pParse,(Expr *)pWVar43);
          pWVar43 = pWVar27->pOuter;
          if (pCVar28 != (CollSeq *)0x0) {
            pbVar1 = (byte *)((long)&pWVar43->pParse + 3);
            *pbVar1 = *pbVar1 | 1;
          }
        }
        else {
          (*(Expr **)&pWVar27->op)->flags = uVar41 & 0xfeff;
        }
      }
      pExpr = *(WhereClause **)&pWVar27->op;
      *(WhereClause **)&pWVar27->op = pWVar43;
      pWVar27->pOuter = pExpr;
      if (0x4c < *(byte *)&pWVar27->pParse) {
        *(byte *)&pWVar27->pParse = (*(byte *)&pWVar27->pParse + 0xb3 ^ 2) + 0x4d;
      }
      pEVar25 = sqlite3ExprSkipCollate((Expr *)pExpr);
      *(int *)((long)ppcVar50 + 0xc) = pEVar25->iTable;
      *(int *)(ppcVar50 + 2) = (int)pEVar25->iColumn;
      ppcVar50[5] = (char *)(BVar22 | local_50);
      ppcVar50[6] = (char *)pEVar24;
      uVar7 = *(u8 *)&pWVar27->pParse;
      if (uVar7 == 'H') {
        sVar36 = 1;
      }
      else if (uVar7 == 'I') {
        sVar36 = 0x80;
      }
      else {
        sVar36 = (short)(2 << (uVar7 + 0xb4 & 0x1f));
      }
      *(ushort *)(ppcVar50 + 3) = sVar16 + sVar36 & uVar34;
    }
  }
  else if (bVar3 == 0x44) {
    pWVar27 = (WhereClause *)sqlite3DbMallocZero(db,0x1f8);
    ppcVar37[2] = (char *)pWVar27;
    if (pWVar27 != (WhereClause *)0x0) {
      *(byte *)((long)ppcVar37 + 0x1a) = *(byte *)((long)ppcVar37 + 0x1a) | 0x10;
      uVar9 = *(u16 *)((long)&pSrc->a[0].zName + 2);
      pWVar27->pParse = *(Parse **)pSrc;
      pWVar27->pMaskSet = pMaskSet;
      pWVar27->pOuter = (WhereClause *)0x0;
      pWVar27->nTerm = 0;
      pWVar27->nSlot = 8;
      pWVar27->a = pWVar27->aStatic;
      pWVar27->wctrlFlags = uVar9;
      pWVar43 = p;
      whereSplit(pWVar27,(Expr *)p,0x44);
      exprAnalyzeAll((SrcList *)pWVar27,pWVar43);
      if (db->mallocFailed == '\0') {
        iVar18 = pWVar27->nTerm;
        pWVar45 = pWVar27->a;
        pPVar40 = (Parse *)0xffffffffffffffff;
        local_a8 = 0xffffffffffffffff;
        while ((0 < iVar18 && (pPVar40 != (Parse *)0x0))) {
          bVar3 = (byte)pWVar45->eOperator;
          if (bVar3 == 0) {
            pWC_00 = (WhereOrInfo *)sqlite3DbMallocRaw(db,0x1f0);
            if (pWC_00 != (WhereOrInfo *)0x0) {
              (pWVar45->u).pOrInfo = pWC_00;
              pWVar45->wtFlags = pWVar45->wtFlags | 0x20;
              pWVar45->eOperator = 0x200;
              uVar9 = *(u16 *)((long)&pSrc->a[0].zName + 2);
              (pWC_00->wc).pParse = *(Parse **)pSrc;
              (pWC_00->wc).pMaskSet = pMaskSet;
              (pWC_00->wc).pOuter = (WhereClause *)0x0;
              (pWC_00->wc).nTerm = 0;
              (pWC_00->wc).nSlot = 8;
              (pWC_00->wc).a = (pWC_00->wc).aStatic;
              (pWC_00->wc).wctrlFlags = uVar9;
              pWVar43 = (WhereClause *)pWVar45->pExpr;
              whereSplit((WhereClause *)pWC_00,(Expr *)pWVar43,0x45);
              exprAnalyzeAll((SrcList *)pWC_00,pWVar43);
              (pWC_00->wc).pOuter = (WhereClause *)pSrc;
              if (db->mallocFailed == '\0') {
                pWVar46 = (pWC_00->wc).a;
                iVar47 = (pWC_00->wc).nTerm;
                if (iVar47 < 1) {
                  iVar47 = 0;
                }
                uVar49 = 0;
                while (bVar51 = iVar47 != 0, iVar47 = iVar47 + -1, bVar51) {
                  bVar3 = pWVar46->pExpr->op;
                  if ((bVar3 & 0xfe) == 0x48 || 0xfffffffa < bVar3 - 0x51) {
                    BVar22 = getMask(pMaskSet,pWVar46->leftCursor);
                    uVar49 = uVar49 | BVar22;
                  }
                  pWVar46 = pWVar46 + 1;
                }
              }
              else {
                uVar49 = 0;
              }
              pPVar40 = (Parse *)((ulong)pPVar40 & uVar49);
            }
            local_a8 = 0;
          }
          else {
            bVar33 = pWVar45->wtFlags;
            if ((bVar33 & 8) == 0) {
              BVar22 = getMask(pMaskSet,pWVar45->leftCursor);
              if ((bVar33 & 2) != 0) {
                BVar29 = getMask(pMaskSet,pWVar27->a[pWVar45->iParent].leftCursor);
                BVar22 = BVar22 | BVar29;
              }
              pPVar40 = (Parse *)((ulong)pPVar40 & BVar22);
              local_a8 = local_a8 & BVar22;
              if ((bVar3 & 2) == 0) {
                local_a8 = 0;
              }
            }
          }
          iVar18 = iVar18 + -1;
          pWVar45 = pWVar45 + 1;
        }
        pWVar27[1].pParse = pPVar40;
        *(ushort *)(ppcVar37 + 3) = (ushort)(pPVar40 != (Parse *)0x0) << 8;
        if (local_a8 != 0) {
          bVar51 = false;
          iVar18 = -1;
          for (uVar17 = 0; (!bVar51 && (uVar17 < 2)); uVar17 = uVar17 + 1) {
            pWVar45 = pWVar27->a;
            iVar47 = pWVar27->nTerm;
            puVar39 = &pWVar45->wtFlags;
            while( true ) {
              if (iVar47 < 1) goto LAB_0017a945;
              pWVar45->wtFlags = pWVar45->wtFlags & 0xbf;
              iCursor = pWVar45->leftCursor;
              if ((iCursor != iVar18) &&
                 (BVar22 = getMask(pMaskSet,iCursor), (local_a8 & BVar22) != 0)) break;
              pWVar45 = pWVar45 + 1;
              iVar47 = iVar47 + -1;
              puVar39 = puVar39 + 0x38;
            }
            iVar18 = (pWVar45->u).leftColumn;
            bVar51 = true;
            while ((iVar47 = iVar47 + -1, bVar51 && (-1 < iVar47))) {
              if (*(int *)(puVar39 + -0xe) == iCursor) {
                bVar51 = false;
                if (((anon_union_8_3_737c4e49_for_u *)(puVar39 + -10))->leftColumn == iVar18) {
                  pEVar25 = ((WhereTerm *)(puVar39 + -0x1a))->pExpr;
                  cVar15 = sqlite3ExprAffinity(pEVar25->pRight);
                  cVar14 = sqlite3ExprAffinity(pEVar25->pLeft);
                  if ((cVar15 == '\0') || (cVar15 == cVar14)) {
                    *puVar39 = *puVar39 | 0x40;
                    goto LAB_0017acbd;
                  }
                }
              }
              else {
                *puVar39 = *puVar39 & 0xbf;
LAB_0017acbd:
                bVar51 = true;
              }
              puVar39 = puVar39 + 0x38;
            }
            iVar18 = iCursor;
          }
          if (bVar51) {
            pWVar45 = pWVar27->a;
            pEVar24 = (ExprList *)0x0;
            pEVar25 = (Expr *)0x0;
            for (iVar18 = pWVar27->nTerm; 0 < iVar18; iVar18 = iVar18 + -1) {
              if ((pWVar45->wtFlags & 0x40) != 0) {
                pEVar25 = sqlite3ExprDup(db,pWVar45->pExpr->pRight,0);
                pEVar24 = sqlite3ExprListAppend(*(Parse **)pSrc,pEVar24,pEVar25);
                pEVar25 = pWVar45->pExpr->pLeft;
              }
              pWVar45 = pWVar45 + 1;
            }
            pEVar25 = sqlite3ExprDup(db,pEVar25,0);
            pEVar25 = sqlite3PExpr(pParse,0x48,pEVar25,(Expr *)0x0,(Token *)0x0);
            if (pEVar25 == (Expr *)0x0) {
              sqlite3ExprListDelete(db,pEVar24);
            }
            else {
              pEVar25->flags = pEVar25->flags | *(u16 *)((long)&p->pParse + 2) & 1;
              pEVar25->iRightJoinTable = *(i16 *)((long)&p->aStatic[0].pExpr + 4);
              (pEVar25->x).pList = pEVar24;
              uVar17 = whereClauseInsert((WhereClause *)pSrc,pEVar25,'\x03');
              exprAnalyze(pSrc,(WhereClause *)(ulong)uVar17,idxTerm_01);
              pTVar38 = pSrc->a[0].pTab;
              *(int *)(&pTVar38->aCol + (long)(int)uVar17 * 7) = iVar42;
              *(undefined1 *)((long)&pTVar38->pSelect + lVar21 + 3) = 1;
            }
            *(undefined2 *)(&pTVar38->pSelect + lVar20 * 7) = 0x800;
          }
        }
      }
    }
LAB_0017a945:
    ppcVar37 = &(pSrc->a[0].pTab)->zName + lVar20 * 7;
  }
  else if ((bVar3 == 0x47) && (*(char *)&pSrc->a[0].zName == 'E')) {
    pEVar24 = ((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->pList;
    puVar39 = "PN";
    for (lVar44 = 0; lVar44 != 0x40; lVar44 = lVar44 + 0x20) {
      bVar3 = *puVar39;
      pEVar25 = sqlite3ExprDup(db,(Expr *)p->pOuter,0);
      pEVar26 = sqlite3ExprDup(db,*(Expr **)((long)&pEVar24->a->pExpr + lVar44),0);
      pEVar25 = sqlite3PExpr(pParse,(uint)bVar3,pEVar25,pEVar26,(Token *)0x0);
      uVar17 = whereClauseInsert((WhereClause *)pSrc,pEVar25,'\x03');
      exprAnalyze(pSrc,(WhereClause *)(ulong)uVar17,idxTerm_00);
      pTVar38 = pSrc->a[0].pTab;
      *(int *)(&pTVar38->aCol + (long)(int)uVar17 * 7) = iVar42;
      ppcVar37 = &pTVar38->zName + lVar20 * 7;
      puVar39 = puVar39 + 1;
    }
    *(undefined1 *)((long)ppcVar37 + 0x1b) = 2;
  }
  if (*(char *)&pSrc->a[0].zName != 'E') goto LAB_0017b3db;
  if (*(u8 *)&p->pParse != 0x97) goto LAB_0017b4c8;
  if ((((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->pList != (ExprList *)0x0) &&
     (((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->pList->nExpr == 2)) {
    db_00 = pParse->db;
    pcVar23 = ((anon_union_8_2_443a03b8_for_u *)&p->pMaskSet)->zToken;
    iVar18 = sqlite3Strlen30(pcVar23);
    pFVar30 = sqlite3FindFunction(db_00,pcVar23,iVar18,2,'\x01','\0');
    if ((pFVar30 != (FuncDef *)0x0) && (bVar3 = pFVar30->flags, (bVar3 & 1) != 0)) {
      pEVar10 = ((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->pList->a;
      pEVar25 = pEVar10[1].pExpr;
      if (pEVar25->op == 0x98) {
        puVar31 = (uchar *)pFVar30->pUserData;
        uVar4 = *puVar31;
        uVar5 = puVar31[1];
        uVar6 = puVar31[2];
        cVar15 = sqlite3ExprAffinity(pEVar25);
        if ((cVar15 == 'a') && ((pEVar25->pTab->tabFlags & 0x10) == 0)) {
          pEVar25 = pEVar10->pExpr;
          uVar7 = pEVar25->op;
          if (uVar7 == 0x84) {
            uVar7 = pEVar25->op2;
          }
          if (uVar7 == 0x85) {
            pVVar11 = pParse->pReprepare;
            sVar16 = pEVar25->iColumn;
            if (pVVar11 == (Vdbe *)0x0) {
LAB_0017afd9:
              pTo = (sqlite3_value *)0x0;
              puVar31 = (uchar *)0x0;
            }
            else {
              pMVar12 = pVVar11->aVar;
              if ((pMVar12[(long)(int)sVar16 + -1].flags & 1) != 0) goto LAB_0017afd9;
              pTo = sqlite3ValueNew(pVVar11->db);
              if (pTo == (sqlite3_value *)0x0) {
                pTo = (sqlite3_value *)0x0;
LAB_0017b090:
                puVar31 = (uchar *)0x0;
              }
              else {
                sqlite3VdbeMemCopy(pTo,pMVar12 + (long)(int)sVar16 + -1);
                sqlite3VdbeMemStoreType(pTo);
                if (pTo->type != '\x03') goto LAB_0017b090;
                puVar31 = sqlite3_value_text(pTo);
              }
            }
            if (sVar16 < 0x21) {
              puVar2 = &pParse->pVdbe->expmask;
              *puVar2 = *puVar2 | 1 << ((char)sVar16 - 1U & 0x1f);
            }
            else {
              pParse->pVdbe->expmask = 0xffffffff;
            }
LAB_0017b0cb:
            if (puVar31 == (uchar *)0x0) goto LAB_0017b194;
            lVar44 = -0x200000000;
            uVar49 = 0;
            do {
              uVar48 = uVar49;
              lVar44 = lVar44 + 0x100000000;
              uVar8 = puVar31[uVar48];
              uVar49 = uVar48 + 1;
              if (((uVar8 == '\0') || (uVar8 == uVar4)) || (uVar8 == uVar5)) break;
            } while (uVar8 != uVar6);
            if ((uVar49 == 1) || (puVar31[lVar44 >> 0x20] == 0xff)) {
              pEVar26 = (Expr *)0x0;
              bVar52 = false;
              bVar51 = true;
            }
            else {
              bVar52 = false;
              if (uVar8 == uVar4) {
                bVar52 = puVar31[uVar49 & 0xffffffff] == '\0';
              }
              pEVar26 = sqlite3Expr(db_00,0x5e,(char *)puVar31);
              if (pEVar26 != (Expr *)0x0) {
                (pEVar26->u).zToken[uVar48] = '\0';
              }
              if (uVar7 == 0x85) {
                pVVar11 = pParse->pVdbe;
                if (pEVar25->iColumn < 0x21) {
                  pVVar11->expmask = pVVar11->expmask | 1 << ((char)pEVar25->iColumn - 1U & 0x1f);
                }
                else {
                  pVVar11->expmask = 0xffffffff;
                }
                if (bVar52) {
                  bVar52 = true;
                  if ((pEVar25->u).zToken[1] != '\0') {
                    iVar18 = sqlite3GetTempReg(pParse);
                    sqlite3ExprCodeTarget(pParse,pEVar25,iVar18);
                    if (pVVar11->nOp != 0) {
                      pVVar11->aOp[pVVar11->nOp - 1].p3 = 0;
                    }
                    sqlite3ReleaseTempReg(pParse,iVar18);
                  }
                }
                else {
                  bVar52 = false;
                }
              }
              bVar51 = false;
            }
          }
          else {
            if (uVar7 == '^') {
              puVar31 = (uchar *)(pEVar25->u).zToken;
              pTo = (sqlite3_value *)0x0;
              goto LAB_0017b0cb;
            }
            pTo = (sqlite3_value *)0x0;
LAB_0017b194:
            bVar51 = true;
            pEVar26 = (Expr *)0x0;
            bVar52 = false;
          }
          sqlite3ValueFree(pTo);
          if (!bVar51) {
            pEVar25 = ((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->pList->a[1].pExpr;
            pRight = sqlite3ExprDup(db,pEVar26,0);
            if (db->mallocFailed == '\0') {
              pcVar23 = (pRight->u).zToken;
              uVar17 = sqlite3Strlen30(pcVar23);
              bVar33 = pcVar23[(ulong)uVar17 - 1];
              if ((bVar3 & 2) == 0) {
                if (bVar33 == 0x40) {
                  bVar52 = false;
                }
                bVar33 = ""[bVar33];
              }
              pcVar23[(ulong)uVar17 - 1] = bVar33 + 1;
            }
            sCollSeqName.z = "BINARY";
            if ((bVar3 & 2) == 0) {
              sCollSeqName.z = "NOCASE";
            }
            sCollSeqName.n = 6;
            pEVar32 = sqlite3ExprDup(db,pEVar25,0);
            pEVar32 = sqlite3ExprAddCollateToken(pParse,pEVar32,&sCollSeqName);
            pEVar26 = sqlite3PExpr(pParse,0x50,pEVar32,pEVar26,(Token *)0x0);
            uVar17 = whereClauseInsert((WhereClause *)pSrc,pEVar26,'\x03');
            exprAnalyze(pSrc,(WhereClause *)(ulong)uVar17,idxTerm_02);
            pEVar25 = sqlite3ExprDup(db,pEVar25,0);
            pEVar25 = sqlite3ExprAddCollateToken(pParse,pEVar25,&sCollSeqName);
            pEVar25 = sqlite3PExpr(pParse,0x4f,pEVar25,pRight,(Token *)0x0);
            uVar19 = whereClauseInsert((WhereClause *)pSrc,pEVar25,'\x03');
            exprAnalyze(pSrc,(WhereClause *)(ulong)uVar19,idxTerm_03);
            pTVar38 = pSrc->a[0].pTab;
            ppcVar37 = &pTVar38->zName + lVar20 * 7;
            if (bVar52) {
              *(int *)(&pTVar38->aCol + (long)(int)uVar17 * 7) = iVar42;
              *(int *)(&pTVar38->aCol + (long)(int)uVar19 * 7) = iVar42;
              *(undefined1 *)((long)ppcVar37 + 0x1b) = 2;
            }
          }
        }
      }
    }
  }
LAB_0017b3db:
  if (((*(u8 *)&p->pParse == 0x97) &&
      (iVar18 = sqlite3_stricmp(((anon_union_8_2_443a03b8_for_u *)&p->pMaskSet)->zToken,"match"),
      iVar18 == 0)) && (((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->pList->nExpr == 2)) {
    pEVar10 = ((anon_union_8_2_a01b6dbf_for_x *)&p->nSlot)->pList->a;
    pEVar25 = pEVar10[1].pExpr;
    if (pEVar25->op == 0x98) {
      pEVar26 = pEVar10->pExpr;
      pcVar23 = (char *)exprTableUsage(pMaskSet,pEVar26);
      BVar22 = exprTableUsage(pMaskSet,pEVar25);
      if ((BVar22 & (ulong)pcVar23) == 0) {
        pEVar26 = sqlite3ExprDup(db,pEVar26,0);
        pEVar26 = sqlite3PExpr(pParse,0x32,(Expr *)0x0,pEVar26,(Token *)0x0);
        iVar18 = whereClauseInsert((WhereClause *)pSrc,pEVar26,'\x03');
        pTVar38 = pSrc->a[0].pTab;
        lVar44 = (long)iVar18;
        (&pTVar38->zColAff)[lVar44 * 7] = pcVar23;
        *(int *)((long)&pTVar38->aCol + lVar44 * 0x38 + 4) = pEVar25->iTable;
        *(int *)(&pTVar38->pIndex + lVar44 * 7) = (int)pEVar25->iColumn;
        *(undefined2 *)(&pTVar38->pSelect + lVar44 * 7) = 0x40;
        *(int *)(&pTVar38->aCol + lVar44 * 7) = iVar42;
        pTVar13 = pSrc->a[0].pTab;
        *(undefined1 *)((long)&pTVar13->pSelect + lVar21 + 3) = 1;
        pbVar1 = (byte *)((long)&pTVar13->pSelect + lVar21 + 2);
        *pbVar1 = *pbVar1 | 8;
        ppcVar37 = &pTVar13->zName + lVar20 * 7;
        (&pTVar38->pCheck)[lVar44 * 7] = (&pTVar13->pCheck)[lVar20 * 7];
      }
    }
  }
LAB_0017b4c8:
  ppcVar37[5] = (char *)((ulong)ppcVar37[5] | local_50);
  return;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* LIKE/GLOB distinguishes case */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWC->pParse;     /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = pWC->pMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = exprTableUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectTableUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = exprListTableUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = exprTableUsage(pMaskSet, pExpr->pRight);
  }
  prereqAll = exprTableUsage(pMaskSet, pExpr);
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = getMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;
    if( pLeft->op==TK_COLUMN ){
      pTerm->leftCursor = pLeft->iTable;
      pTerm->u.leftColumn = pLeft->iColumn;
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( pRight && pRight->op==TK_COLUMN ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        pNew->iParent = idxTerm;
        pTerm = &pWC->a[idxTerm];
        pTerm->nChild = 1;
        pTerm->wtFlags |= TERM_COPIED;
        if( pExpr->op==TK_EQ
         && !ExprHasProperty(pExpr, EP_FromJoin)
         && OptimizationEnabled(db, SQLITE_Transitive)
        ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pLeft = sqlite3ExprSkipCollate(pDup->pLeft);
      pNew->leftCursor = pLeft->iTable;
      pNew->u.leftColumn = pLeft->iColumn;
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0), 0);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      pWC->a[idxNew].iParent = idxTerm;
    }
    pTerm->nChild = 2;
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'abc%'" is changed into constraints
  **
  **          x>='abc' AND x<'abd' AND x LIKE 'abc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    Token sCollSeqName;  /* Name of collating sequence */

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);
    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;   /* EV: R-64339-08207 */


        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    sCollSeqName.z = noCase ? "NOCASE" : "BINARY";
    sCollSeqName.n = 6;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE, 
           sqlite3ExprAddCollateToken(pParse,pNewExpr1,&sCollSeqName),
           pStr1, 0);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, TERM_VIRTUAL|TERM_DYNAMIC);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateToken(pParse,pNewExpr2,&sCollSeqName),
           pStr2, 0);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, TERM_VIRTUAL|TERM_DYNAMIC);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      pWC->a[idxNew1].iParent = idxTerm;
      pWC->a[idxNew2].iParent = idxTerm;
      pTerm->nChild = 2;
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_MATCH auxiliary term to the constraint set if the
  ** current expression is of the form:  column MATCH expr.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( isMatchOfColumn(pExpr) ){
    int idxNew;
    Expr *pRight, *pLeft;
    WhereTerm *pNewTerm;
    Bitmask prereqColumn, prereqExpr;

    pRight = pExpr->x.pList->a[0].pExpr;
    pLeft = pExpr->x.pList->a[1].pExpr;
    prereqExpr = exprTableUsage(pMaskSet, pRight);
    prereqColumn = exprTableUsage(pMaskSet, pLeft);
    if( (prereqExpr & prereqColumn)==0 ){
      Expr *pNewExpr;
      pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
                              0, sqlite3ExprDup(db, pRight, 0), 0);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = prereqExpr;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_MATCH;
      pNewTerm->iParent = idxTerm;
      pTerm = &pWC->a[idxTerm];
      pTerm->nChild = 1;
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

#ifdef SQLITE_ENABLE_STAT3
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.  This
  ** TERM_VNULL tag will suppress the not-null check at the beginning
  ** of the loop.  Without the TERM_VNULL flag, the not-null check at
  ** the start of the loop will prevent any results from being returned.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3PExpr(pParse, TK_NULL, 0, 0, 0), 0);

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      pNewTerm->iParent = idxTerm;
      pTerm = &pWC->a[idxTerm];
      pTerm->nChild = 1;
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  pTerm->prereqRight |= extraRight;
}